

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  undefined8 *puVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  CachedAllocator alloc_00;
  FastAllocator *this_01;
  ThreadLocal *pTVar7;
  undefined8 this_02;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *pBVar8;
  undefined1 (*pauVar9) [16];
  int *piVar10;
  size_t sVar11;
  undefined8 *puVar12;
  ulong uVar13;
  range<unsigned_int> rVar14;
  range<unsigned_int> *current_00;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  range<unsigned_int> rVar18;
  uint uVar19;
  ulong uVar20;
  range<unsigned_int> rVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  range<unsigned_int> children [8];
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  undefined8 *local_258;
  ThreadLocal2 *local_250;
  undefined1 local_248 [16];
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_230;
  BVHNodeRecord<embree::NodeRefPtr<4>_> local_228;
  range<unsigned_int> local_1f8 [8];
  undefined8 *local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 local_1a8;
  int iStack_19c;
  undefined8 local_198 [45];
  
  local_248._8_8_ = local_248._0_8_;
  this_01 = alloc.alloc;
  pTVar7 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"depth limit reached","");
    *puVar12 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar12 + 1) = 1;
    puVar12[2] = puVar12 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 2),local_1b8,(long)local_1b8 + CONCAT71(uStack_1af,local_1b0));
    __cxa_throw(puVar12,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar23 = (this->super_Settings).maxLeafSize;
  if (current->_end - current->_begin <= uVar23) {
    CreateMortonLeaf<4,_embree::Object>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
    return __return_storage_ptr__;
  }
  local_1f8[0] = *current;
  uVar25 = (this->super_Settings).branchingFactor;
  uVar13 = 2;
  if (2 < uVar25) {
    uVar13 = uVar25;
  }
  uVar25 = 1;
  rVar14 = *current;
  do {
    uVar16 = 0;
    uVar20 = 0;
    uVar17 = 0xffffffffffffffff;
    do {
      uVar22 = (ulong)(local_1f8[uVar16]._end - local_1f8[uVar16]._begin);
      uVar15 = uVar16;
      if (uVar22 <= uVar23 || uVar22 <= uVar20) {
        uVar15 = uVar17;
        uVar22 = uVar20;
      }
      uVar20 = uVar22;
      uVar16 = uVar16 + 1;
      uVar17 = uVar15;
    } while (uVar25 != uVar16);
    uVar17 = uVar25;
    if (uVar15 == 0xffffffffffffffff) break;
    uVar19 = local_1f8[uVar15]._end + local_1f8[uVar15]._begin >> 1;
    rVar18._end = local_1f8[uVar15]._end;
    rVar18._begin = uVar19;
    rVar21._end = uVar19;
    rVar21._begin = local_1f8[uVar15]._begin;
    local_1f8[uVar15] = rVar14;
    local_1f8[uVar25 - 1] = rVar21;
    local_1f8[uVar25] = rVar18;
    uVar25 = uVar25 + 1;
    rVar14 = rVar18;
    uVar17 = uVar13;
  } while (uVar25 != uVar13);
  local_258 = (undefined8 *)0x80;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_228._8_1_ = '\x01';
    local_228.ref.ptr = (size_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_00->alloc0).end = auVar26._0_8_;
    (this_00->alloc0).allocBlockSize = auVar26._8_8_;
    (this_00->alloc0).bytesUsed = auVar26._16_8_;
    (this_00->alloc0).bytesWasted = auVar26._24_8_;
    (this_00->alloc0).ptr = (char *)auVar26._0_8_;
    (this_00->alloc0).cur = auVar26._8_8_;
    (this_00->alloc0).end = auVar26._16_8_;
    (this_00->alloc0).allocBlockSize = auVar26._24_8_;
    auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_01 == (FastAllocator *)0x0) {
      (this_00->alloc1).end = auVar26._0_8_;
      (this_00->alloc1).allocBlockSize = auVar26._8_8_;
      (this_00->alloc1).bytesUsed = auVar26._16_8_;
      (this_00->alloc1).bytesWasted = auVar26._24_8_;
      (this_00->alloc1).ptr = (char *)auVar26._0_8_;
      (this_00->alloc1).cur = auVar26._8_8_;
      (this_00->alloc1).end = auVar26._16_8_;
      (this_00->alloc1).allocBlockSize = auVar26._24_8_;
    }
    else {
      (this_00->alloc0).allocBlockSize = this_01->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)auVar26._0_8_;
      (this_00->alloc1).cur = auVar26._8_8_;
      (this_00->alloc1).end = auVar26._16_8_;
      (this_00->alloc1).allocBlockSize = auVar26._24_8_;
      (this_00->alloc1).end = auVar26._0_8_;
      (this_00->alloc1).allocBlockSize = auVar26._8_8_;
      (this_00->alloc1).bytesUsed = auVar26._16_8_;
      (this_00->alloc1).bytesWasted = auVar26._24_8_;
      (this_00->alloc1).allocBlockSize = this_01->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = this_01;
    UNLOCK();
    local_1b8 = &FastAllocator::s_thread_local_allocators_lock;
    local_1b0 = 1;
    local_250 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_01->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_01->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_01->thread_local_allocators,__position,&local_250);
    }
    else {
      *__position._M_current = local_250;
      pppTVar2 = &(this_01->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_228._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_228.ref.ptr);
    }
  }
  puVar12 = local_258;
  pTVar7->bytesUsed = pTVar7->bytesUsed + (long)local_258;
  sVar11 = pTVar7->cur;
  uVar23 = (ulong)(-(int)sVar11 & 0xf);
  uVar25 = (long)local_258 + uVar23 + sVar11;
  pTVar7->cur = uVar25;
  local_248._0_8_ = this;
  local_230 = __return_storage_ptr__;
  if (pTVar7->end < uVar25) {
    pTVar7->cur = sVar11;
    puVar5 = (undefined8 *)pTVar7->allocBlockSize;
    if ((undefined8 *)((long)local_258 * 4) < puVar5 || (long)local_258 * 4 - (long)puVar5 == 0) {
      local_1b8 = puVar5;
      pcVar24 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
      pTVar7->ptr = pcVar24;
      sVar11 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar11;
      pTVar7->end = (size_t)local_1b8;
      pTVar7->cur = (size_t)puVar12;
      if (local_1b8 < puVar12) {
        pTVar7->cur = 0;
        local_1b8 = (undefined8 *)pTVar7->allocBlockSize;
        pcVar24 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
        pTVar7->ptr = pcVar24;
        sVar11 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar11;
        pTVar7->end = (size_t)local_1b8;
        pTVar7->cur = (size_t)puVar12;
        if (local_1b8 < puVar12) {
          pTVar7->cur = 0;
          pcVar24 = (char *)0x0;
          goto LAB_01488644;
        }
      }
      pTVar7->bytesWasted = sVar11;
    }
    else {
      pcVar24 = (char *)FastAllocator::malloc(this_01,(size_t)&local_258);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar23;
    pcVar24 = pTVar7->ptr + (uVar25 - (long)local_258);
  }
LAB_01488644:
  pcVar24[0x60] = '\0';
  pcVar24[0x61] = '\0';
  pcVar24[0x62] = -0x80;
  pcVar24[99] = '\x7f';
  pcVar24[100] = '\0';
  pcVar24[0x65] = '\0';
  pcVar24[0x66] = -0x80;
  pcVar24[0x67] = '\x7f';
  pcVar24[0x68] = '\0';
  pcVar24[0x69] = '\0';
  pcVar24[0x6a] = -0x80;
  pcVar24[0x6b] = '\x7f';
  pcVar24[0x6c] = '\0';
  pcVar24[0x6d] = '\0';
  pcVar24[0x6e] = -0x80;
  pcVar24[0x6f] = '\x7f';
  pcVar24[0x40] = '\0';
  pcVar24[0x41] = '\0';
  pcVar24[0x42] = -0x80;
  pcVar24[0x43] = '\x7f';
  pcVar24[0x44] = '\0';
  pcVar24[0x45] = '\0';
  pcVar24[0x46] = -0x80;
  pcVar24[0x47] = '\x7f';
  pcVar24[0x48] = '\0';
  pcVar24[0x49] = '\0';
  pcVar24[0x4a] = -0x80;
  pcVar24[0x4b] = '\x7f';
  pcVar24[0x4c] = '\0';
  pcVar24[0x4d] = '\0';
  pcVar24[0x4e] = -0x80;
  pcVar24[0x4f] = '\x7f';
  pcVar24[0x20] = '\0';
  pcVar24[0x21] = '\0';
  pcVar24[0x22] = -0x80;
  pcVar24[0x23] = '\x7f';
  pcVar24[0x24] = '\0';
  pcVar24[0x25] = '\0';
  pcVar24[0x26] = -0x80;
  pcVar24[0x27] = '\x7f';
  pcVar24[0x28] = '\0';
  pcVar24[0x29] = '\0';
  pcVar24[0x2a] = -0x80;
  pcVar24[0x2b] = '\x7f';
  pcVar24[0x2c] = '\0';
  pcVar24[0x2d] = '\0';
  pcVar24[0x2e] = -0x80;
  pcVar24[0x2f] = '\x7f';
  pcVar24[0x70] = '\0';
  pcVar24[0x71] = '\0';
  pcVar24[0x72] = -0x80;
  pcVar24[0x73] = -1;
  pcVar24[0x74] = '\0';
  pcVar24[0x75] = '\0';
  pcVar24[0x76] = -0x80;
  pcVar24[0x77] = -1;
  pcVar24[0x78] = '\0';
  pcVar24[0x79] = '\0';
  pcVar24[0x7a] = -0x80;
  pcVar24[0x7b] = -1;
  pcVar24[0x7c] = '\0';
  pcVar24[0x7d] = '\0';
  pcVar24[0x7e] = -0x80;
  pcVar24[0x7f] = -1;
  pcVar24[0x50] = '\0';
  pcVar24[0x51] = '\0';
  pcVar24[0x52] = -0x80;
  pcVar24[0x53] = -1;
  pcVar24[0x54] = '\0';
  pcVar24[0x55] = '\0';
  pcVar24[0x56] = -0x80;
  pcVar24[0x57] = -1;
  pcVar24[0x58] = '\0';
  pcVar24[0x59] = '\0';
  pcVar24[0x5a] = -0x80;
  pcVar24[0x5b] = -1;
  pcVar24[0x5c] = '\0';
  pcVar24[0x5d] = '\0';
  pcVar24[0x5e] = -0x80;
  pcVar24[0x5f] = -1;
  pcVar24[0x30] = '\0';
  pcVar24[0x31] = '\0';
  pcVar24[0x32] = -0x80;
  pcVar24[0x33] = -1;
  pcVar24[0x34] = '\0';
  pcVar24[0x35] = '\0';
  pcVar24[0x36] = -0x80;
  pcVar24[0x37] = -1;
  pcVar24[0x38] = '\0';
  pcVar24[0x39] = '\0';
  pcVar24[0x3a] = -0x80;
  pcVar24[0x3b] = -1;
  pcVar24[0x3c] = '\0';
  pcVar24[0x3d] = '\0';
  pcVar24[0x3e] = -0x80;
  pcVar24[0x3f] = -1;
  pcVar24[0] = '\b';
  pcVar24[1] = '\0';
  pcVar24[2] = '\0';
  pcVar24[3] = '\0';
  pcVar24[4] = '\0';
  pcVar24[5] = '\0';
  pcVar24[6] = '\0';
  pcVar24[7] = '\0';
  pcVar24[8] = '\b';
  pcVar24[9] = '\0';
  pcVar24[10] = '\0';
  pcVar24[0xb] = '\0';
  pcVar24[0xc] = '\0';
  pcVar24[0xd] = '\0';
  pcVar24[0xe] = '\0';
  pcVar24[0xf] = '\0';
  pcVar24[0x10] = '\b';
  pcVar24[0x11] = '\0';
  pcVar24[0x12] = '\0';
  pcVar24[0x13] = '\0';
  pcVar24[0x14] = '\0';
  pcVar24[0x15] = '\0';
  pcVar24[0x16] = '\0';
  pcVar24[0x17] = '\0';
  pcVar24[0x18] = '\b';
  pcVar24[0x19] = '\0';
  pcVar24[0x1a] = '\0';
  pcVar24[0x1b] = '\0';
  pcVar24[0x1c] = '\0';
  pcVar24[0x1d] = '\0';
  pcVar24[0x1e] = '\0';
  pcVar24[0x1f] = '\0';
  current_00 = local_1f8;
  puVar12 = local_198;
  this_02 = local_248._0_8_;
  uVar23 = uVar17;
  do {
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(&local_228,
                    (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
                     *)this_02,depth + 1,current_00,alloc_00);
    pBVar8 = local_230;
    puVar12[-4] = local_228.ref.ptr;
    puVar12[-2] = local_228.bounds.lower.field_0._0_8_;
    puVar12[-1] = local_228.bounds.lower.field_0._8_8_;
    *puVar12 = local_228.bounds.upper.field_0._0_8_;
    puVar12[1] = local_228.bounds.upper.field_0._8_8_;
    puVar12 = puVar12 + 6;
    current_00 = current_00 + 1;
    uVar23 = uVar23 - 1;
  } while (uVar23 != 0);
  pauVar9 = (undefined1 (*) [16])local_198;
  uVar23 = 0;
  auVar27._8_4_ = 0x7f800000;
  auVar27._0_8_ = 0x7f8000007f800000;
  auVar27._12_4_ = 0x7f800000;
  auVar29 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
  do {
    auVar28 = pauVar9[-1];
    auVar3 = *pauVar9;
    *(undefined8 *)(pcVar24 + uVar23 * 8) = *(undefined8 *)pauVar9[-2];
    *(int *)(pcVar24 + uVar23 * 4 + 0x20) = auVar28._0_4_;
    uVar4 = vextractps_avx(auVar28,1);
    *(undefined4 *)(pcVar24 + uVar23 * 4 + 0x40) = uVar4;
    uVar4 = vextractps_avx(auVar28,2);
    *(undefined4 *)(pcVar24 + uVar23 * 4 + 0x60) = uVar4;
    *(int *)(pcVar24 + uVar23 * 4 + 0x30) = auVar3._0_4_;
    uVar4 = vextractps_avx(auVar3,1);
    *(undefined4 *)(pcVar24 + uVar23 * 4 + 0x50) = uVar4;
    auVar27 = vminps_avx(auVar27,auVar28);
    uVar4 = vextractps_avx(auVar3,2);
    *(undefined4 *)(pcVar24 + uVar23 * 4 + 0x70) = uVar4;
    auVar28 = vmaxps_avx(auVar29._0_16_,auVar3);
    auVar29 = ZEXT1664(auVar28);
    uVar23 = uVar23 + 1;
    pauVar9 = pauVar9 + 3;
  } while (uVar17 != uVar23);
  piVar10 = &iStack_19c;
  uVar25 = 0;
  uVar23 = uVar17;
  do {
    uVar25 = uVar25 + (long)*piVar10;
    piVar10 = piVar10 + 0xc;
    uVar23 = uVar23 - 1;
  } while (uVar23 != 0);
  if (0xfff < uVar25) {
    piVar10 = &iStack_19c;
    uVar23 = 0;
    local_248 = auVar28;
    do {
      if (*piVar10 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar24 + uVar23 * 8),1);
        auVar29 = ZEXT1664(local_248);
        pcVar24[uVar23 * 8 + 7] = pcVar24[uVar23 * 8 + 7] | 0x80;
      }
      auVar28 = auVar29._0_16_;
      uVar23 = uVar23 + 1;
      piVar10 = piVar10 + 0xc;
    } while (uVar17 != uVar23);
  }
  aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar27,ZEXT416((uint)uVar25),0x30);
  (pBVar8->ref).ptr = (size_t)pcVar24;
  (pBVar8->bounds).lower.field_0 = aVar6;
  *(undefined1 (*) [16])(pBVar8->bounds).upper.field_0.m128 = auVar28;
  return pBVar8;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }